

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall
cmComputeLinkDepends::FollowSharedDeps
          (cmComputeLinkDepends *this,size_t depender_index,cmLinkInterface *iface,
          bool follow_interface)

{
  pair<std::_Rb_tree_iterator<unsigned_long>,_bool> pVar1;
  size_t local_20;
  
  local_20 = depender_index;
  pVar1 = std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&this->SharedDepFollowed,&local_20);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (follow_interface) {
      QueueSharedDependencies
                (this,local_20,(vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
    }
    QueueSharedDependencies(this,local_20,&iface->SharedDeps);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::FollowSharedDeps(size_t depender_index,
                                            cmLinkInterface const* iface,
                                            bool follow_interface)
{
  // Follow dependencies if we have not followed them already.
  if (this->SharedDepFollowed.insert(depender_index).second) {
    if (follow_interface) {
      this->QueueSharedDependencies(depender_index, iface->Libraries);
    }
    this->QueueSharedDependencies(depender_index, iface->SharedDeps);
  }
}